

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

BBox3fa * __thiscall embree::SceneGraph::QuadMeshNode::bounds(QuadMeshNode *this)

{
  Vec3fa *pVVar1;
  size_t sVar2;
  bool bVar3;
  long in_RSI;
  BBox3fa *in_RDI;
  float fVar4;
  Vec3fa *x;
  const_iterator __end3;
  const_iterator __begin3;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *__range3;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range2;
  BBox3fa *b;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffffdf8;
  BBox3fa *__lhs;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_1c0;
  __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_1a0;
  long local_198;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_154;
  Vec3fa *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_f0;
  undefined8 *local_e0;
  Vec3fa *local_d8;
  undefined8 *local_d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_c0;
  undefined8 *local_b0;
  undefined1 local_a8 [16];
  undefined8 *local_98;
  anon_union_16_2_47237d3f_for_Vec3fa_0 *local_90;
  Vec3fa *local_88;
  undefined8 *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  reference local_10;
  reference local_8;
  
  local_128 = &pos_inf;
  __lhs = in_RDI;
  local_168 = std::numeric_limits<float>::infinity();
  *(ulong *)&(in_RDI->lower).field_0 = CONCAT44(local_168,local_168);
  *(ulong *)((long)&(in_RDI->lower).field_0 + 8) = CONCAT44(local_168,local_168);
  local_120 = &neg_inf;
  fStack_164 = local_168;
  fStack_160 = local_168;
  fStack_15c = local_168;
  local_154 = local_168;
  local_150 = &in_RDI->upper;
  fVar4 = std::numeric_limits<float>::infinity();
  local_148 = -fVar4;
  *(ulong *)&(in_RDI->upper).field_0 = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  *(ulong *)((long)&(in_RDI->upper).field_0 + 8) = CONCAT44(fVar4,fVar4) ^ 0x8000000080000000;
  local_198 = in_RSI + 0x70;
  fStack_144 = local_148;
  fStack_140 = local_148;
  fStack_13c = local_148;
  local_138 = local_148;
  local_1a0._M_current =
       (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
       std::
       vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
       ::begin(in_stack_fffffffffffffdf8);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::end(in_stack_fffffffffffffdf8);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                        *)__lhs,(__normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                 *)in_stack_fffffffffffffdf8);
    if (!bVar3) break;
    local_10 = __gnu_cxx::
               __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
               ::operator*(&local_1a0);
    pVVar1 = local_10->items;
    sVar2 = local_10->size_active;
    for (local_1c0 = &local_10->items->field_0; local_1c0 != &pVVar1[sVar2].field_0;
        local_1c0 = local_1c0 + 1) {
      local_f0 = local_1c0;
      local_b0 = &local_108;
      local_c0 = local_1c0;
      local_28 = *(undefined8 *)&(__lhs->lower).field_0;
      uStack_20 = *(undefined8 *)((long)&(__lhs->lower).field_0 + 8);
      local_38 = *(undefined8 *)local_1c0;
      uStack_30 = *(undefined8 *)(local_1c0->m128 + 2);
      local_a8 = minps((undefined1  [16])(__lhs->lower).field_0,
                       (undefined1  [16])*(__m128 *)local_1c0);
      local_98 = &local_108;
      local_108 = local_a8._0_8_;
      uStack_100 = local_a8._8_8_;
      local_d0 = &local_108;
      *(undefined8 *)&(__lhs->lower).field_0 = local_a8._0_8_;
      *(undefined8 *)((long)&(__lhs->lower).field_0 + 8) = local_a8._8_8_;
      local_88 = &__lhs->upper;
      local_80 = &local_118;
      local_90 = local_1c0;
      local_68 = *(undefined8 *)&local_88->field_0;
      uStack_60 = *(undefined8 *)((long)&(__lhs->upper).field_0 + 8);
      local_78 = *(undefined8 *)local_1c0;
      uStack_70 = *(undefined8 *)(local_1c0->m128 + 2);
      local_58 = maxps((undefined1  [16])local_88->field_0,(undefined1  [16])*(__m128 *)local_1c0);
      local_40 = &local_118;
      local_118 = local_58._0_8_;
      uStack_110 = local_58._8_8_;
      local_d8 = &__lhs->upper;
      local_e0 = &local_118;
      *(undefined8 *)&local_d8->field_0 = local_58._0_8_;
      *(undefined8 *)((long)&(__lhs->upper).field_0 + 8) = local_58._8_8_;
    }
    local_8 = local_10;
    __gnu_cxx::
    __normal_iterator<const_embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
    ::operator++(&local_1a0);
  }
  return in_RDI;
}

Assistant:

virtual BBox3fa bounds() const
      {
        BBox3fa b = empty;
        for (const auto& p : positions)
          for (auto& x : p)
            b.extend(x);
        return b;
      }